

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_ber_signature(uchar *sig,size_t *len,int *certainly_der,int *certainly_not_der)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  undefined4 *in_RCX;
  uint *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  bool bVar10;
  bool bVar11;
  int i;
  int add_1;
  int tlenlen;
  int add;
  int n;
  int indet;
  size_t glen;
  size_t elen;
  size_t tlen;
  int nzlen [2];
  int nhbyte [2];
  int nhbit [2];
  int nlenlen [2];
  int nlen [2];
  int nlow [2];
  int der;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  int local_124;
  ulong uVar12;
  ulong uVar13;
  uchar *in_stack_fffffffffffffef0;
  ulong local_108;
  uint local_ec;
  uint local_d8;
  uint local_d0;
  uint local_c0;
  uint local_b8;
  uint local_b0;
  uint local_a8;
  uint32_t local_98;
  uint local_90;
  int local_88;
  int local_80;
  int local_78;
  ulong local_60;
  uint local_54 [6];
  int local_3c;
  int local_38;
  uint32_t local_34 [2];
  uint auStack_2c [3];
  undefined4 *local_20;
  uint *local_18;
  ulong *local_10;
  long local_8;
  
  *in_RSI = 0;
  iVar6 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar7 = secp256k1_testrand_bits(iVar6);
  auStack_2c[2] = (uint)(uVar7 == 0);
  *local_18 = auStack_2c[2];
  *local_20 = 0;
  if (auStack_2c[2] == 0) {
    uVar3 = secp256k1_testrand_int((uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    bVar10 = uVar3 == 0;
  }
  else {
    bVar10 = false;
  }
  for (local_78 = 0; uVar3 = (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20), local_78 < 2;
      local_78 = local_78 + 1) {
    if (auStack_2c[2] == 0) {
      uVar7 = secp256k1_testrand_bits(iVar6);
      local_90 = (uint)(uVar7 != 0);
    }
    else {
      local_90 = 1;
    }
    auStack_2c[local_78] = local_90;
    uVar3 = (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    if (auStack_2c[local_78] == 0) {
      uVar3 = secp256k1_testrand_int(uVar3);
      uVar7 = secp256k1_testrand_bits(iVar6);
      local_98 = (int)(uVar3 * uVar7 >> 3) + 0x20;
    }
    else {
      local_98 = secp256k1_testrand_int(uVar3);
    }
    local_34[local_78] = local_98;
    if (0xe8 < (int)local_34[local_78]) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1b88,"test condition failed: nlen[n] <= 232");
      abort();
    }
    if ((auStack_2c[local_78] == 0) && (local_34[local_78] == 0x20)) {
      local_a8 = 1;
    }
    else {
      if (local_34[local_78] == 0) {
        local_b0 = 0;
      }
      else {
        uVar7 = secp256k1_testrand_bits(iVar6);
        local_b0 = (uint)uVar7;
      }
      local_a8 = local_b0;
    }
    local_54[(long)local_78 + 4] = local_a8;
    if (local_34[local_78] == 0) {
      local_b8 = 0;
    }
    else {
      if (local_54[(long)local_78 + 4] == 0) {
        uVar3 = secp256k1_testrand_int((uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
        local_c0 = uVar3 + 1;
      }
      else {
        uVar7 = secp256k1_testrand_bits(iVar6);
        local_c0 = (int)uVar7 + 0x80;
      }
      local_b8 = local_c0;
    }
    local_54[(long)local_78 + 2] = local_b8;
    if (auStack_2c[2] == 0) {
      uVar3 = (uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      if (auStack_2c[local_78] == 0) {
        uVar3 = secp256k1_testrand_int(uVar3);
        uVar7 = secp256k1_testrand_bits(iVar6);
        local_d8 = (uint)(uVar3 * uVar7 >> 3);
      }
      else {
        local_d8 = secp256k1_testrand_int(uVar3);
      }
      local_d0 = local_d8;
    }
    else {
      bVar11 = true;
      if (local_34[local_78] != 0) {
        bVar11 = local_54[(long)local_78 + 4] != 0;
      }
      local_d0 = (uint)bVar11;
    }
    local_54[local_78] = local_d0;
    bVar11 = true;
    if (local_34[local_78] != 0) {
      bVar11 = local_54[(long)local_78 + 4] != 0;
    }
    if ((int)(uint)bVar11 < (int)local_54[local_78]) {
      *local_20 = 1;
    }
    if (300 < (int)(local_34[local_78] + local_54[local_78])) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1b92,"test condition failed: nlen[n] + nzlen[n] <= 300");
      abort();
    }
    if ((int)(local_34[local_78] + local_54[local_78]) < 0x80) {
      local_ec = 0;
    }
    else {
      local_ec = 2;
      if ((int)(local_34[local_78] + local_54[local_78]) < 0x100) {
        local_ec = 1;
      }
    }
    local_54[(long)local_78 + 6] = local_ec;
    if (auStack_2c[2] == 0) {
      uVar3 = secp256k1_testrand_int((uint32_t)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      uVar7 = secp256k1_testrand_bits(iVar6);
      uVar8 = secp256k1_testrand_bits(iVar6);
      iVar4 = (int)(uVar3 * uVar7 * uVar8 >> 8);
      local_54[(long)local_78 + 6] = iVar4 + local_54[(long)local_78 + 6];
      if (iVar4 != 0) {
        *local_20 = 1;
      }
    }
    if (0x1ab < (int)(local_34[local_78] + local_54[local_78] + local_54[(long)local_78 + 6])) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x1b9d,"test condition failed: nlen[n] + nzlen[n] + nlenlen[n] <= 427");
      abort();
    }
  }
  local_60 = (ulong)(int)(local_3c + local_34[0] + local_54[0] + 4 + local_38 + local_34[1] +
                         local_54[1]);
  if (0x358 < local_60) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1ba2,"test condition failed: tlen <= 856");
    abort();
  }
  if ((auStack_2c[2] != 0) || (bVar10)) {
    local_108 = 0;
  }
  else {
    uVar5 = secp256k1_testrand_int(uVar3);
    in_stack_fffffffffffffef0 = (uchar *)(ulong)uVar5;
    uVar7 = secp256k1_testrand_bits(iVar6);
    local_108 = (long)in_stack_fffffffffffffef0 * uVar7 >> 3;
  }
  if (local_108 != 0) {
    *local_20 = 1;
  }
  local_60 = local_108 + local_60;
  if (0x3d4 < local_60) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1baa,"test condition failed: tlen <= 980");
    abort();
  }
  if (auStack_2c[2] == 0) {
    uVar5 = secp256k1_testrand_int(uVar3);
    uVar7 = secp256k1_testrand_bits(iVar6);
    uVar12 = uVar5 * uVar7 >> 3;
  }
  else {
    uVar12 = 0;
  }
  if (uVar12 != 0) {
    *local_20 = 1;
  }
  if (0x3de < local_60 + uVar12) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1bb1,"test condition failed: tlen + glen <= 990");
    abort();
  }
  uVar13 = *local_10;
  *local_10 = uVar13 + 1;
  *(undefined1 *)(local_8 + uVar13) = 0x30;
  uVar13 = uVar12;
  if (bVar10) {
    uVar2 = *local_10;
    *local_10 = uVar2 + 1;
    *(undefined1 *)(local_8 + uVar2) = 0x80;
    *local_20 = 1;
  }
  else {
    if (local_60 < 0x80) {
      local_124 = 0;
    }
    else {
      local_124 = 2;
      if (local_60 < 0x100) {
        local_124 = 1;
      }
    }
    local_80 = local_124;
    if (auStack_2c[2] == 0) {
      uVar3 = secp256k1_testrand_int(uVar3);
      uVar7 = secp256k1_testrand_bits(0);
      lVar9 = uVar3 * uVar7;
      uVar7 = secp256k1_testrand_bits(0);
      iVar6 = (int)(lVar9 * uVar7 >> 8);
      local_80 = iVar6 + local_124;
      if (iVar6 != 0) {
        *local_20 = 1;
      }
    }
    if (local_80 == 0) {
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(char *)(local_8 + uVar2) = (char)local_60;
    }
    else {
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(char *)(local_8 + uVar2) = (char)local_80 + -0x80;
      assign_big_endian((uchar *)(local_8 + *local_10),(long)local_80,(uint32_t)local_60);
      *local_10 = (long)local_80 + *local_10;
    }
    local_60 = (long)local_80 + local_60;
  }
  if (0x45f < local_60 + 2 + uVar12) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1bce,"test condition failed: tlen + glen <= 1119");
    abort();
  }
  for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
    uVar2 = *local_10;
    *local_10 = uVar2 + 1;
    *(undefined1 *)(local_8 + uVar2) = 2;
    if (local_54[(long)local_78 + 6] == 0) {
      uVar3 = local_34[local_78];
      uVar1 = local_54[local_78];
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(char *)(local_8 + uVar2) = (char)uVar3 + (char)uVar1;
    }
    else {
      uVar1 = local_54[(long)local_78 + 6];
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(char *)(local_8 + uVar2) = (char)uVar1 + -0x80;
      assign_big_endian((uchar *)(local_8 + *local_10),(long)(int)local_54[(long)local_78 + 6],
                        local_34[local_78] + local_54[local_78]);
      *local_10 = (long)(int)local_54[(long)local_78 + 6] + *local_10;
    }
    while (0 < (int)local_54[local_78]) {
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(undefined1 *)(local_8 + uVar2) = 0;
      local_54[local_78] = local_54[local_78] - 1;
    }
    if ((local_34[local_78] == 0x20) && (auStack_2c[local_78] == 0)) {
      for (local_88 = 0; local_88 < 0x10; local_88 = local_88 + 1) {
        uVar2 = *local_10;
        *local_10 = uVar2 + 1;
        *(undefined1 *)(local_8 + uVar2) = 0xff;
      }
      local_34[local_78] = local_34[local_78] - 0x10;
    }
    if (0 < (int)local_34[local_78]) {
      uVar1 = local_54[(long)local_78 + 2];
      uVar2 = *local_10;
      *local_10 = uVar2 + 1;
      *(char *)(local_8 + uVar2) = (char)uVar1;
      local_34[local_78] = local_34[local_78] - 1;
    }
    secp256k1_testrand_bytes_test(in_stack_fffffffffffffef0,uVar13);
    *local_10 = (long)(int)local_34[local_78] + *local_10;
    local_34[local_78] = 0;
  }
  secp256k1_testrand_bytes_test(in_stack_fffffffffffffef0,uVar13);
  *local_10 = local_108 + *local_10;
  uVar2 = local_60 + 2;
  if (bVar10) {
    uVar2 = *local_10;
    *local_10 = uVar2 + 1;
    *(undefined1 *)(local_8 + uVar2) = 0;
    uVar2 = *local_10;
    *local_10 = uVar2 + 1;
    *(undefined1 *)(local_8 + uVar2) = 0;
    uVar2 = local_60 + 4;
  }
  local_60 = uVar2;
  if (0x461 < local_60 + uVar12) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1bfe,"test condition failed: tlen + glen <= 1121");
    abort();
  }
  secp256k1_testrand_bytes_test(in_stack_fffffffffffffef0,uVar13);
  *local_10 = uVar12 + *local_10;
  if (0x461 < uVar12 + local_60) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c04,"test condition failed: tlen <= 1121");
    abort();
  }
  if (uVar12 + local_60 != *local_10) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1c05,"test condition failed: tlen == *len");
    abort();
  }
  return;
}

Assistant:

static void random_ber_signature(unsigned char *sig, size_t *len, int* certainly_der, int* certainly_not_der) {
    int der;
    int nlow[2], nlen[2], nlenlen[2], nhbit[2], nhbyte[2], nzlen[2];
    size_t tlen, elen, glen;
    int indet;
    int n;

    *len = 0;
    der = secp256k1_testrand_bits(2) == 0;
    *certainly_der = der;
    *certainly_not_der = 0;
    indet = der ? 0 : secp256k1_testrand_int(10) == 0;

    for (n = 0; n < 2; n++) {
        /* We generate two classes of numbers: nlow==1 "low" ones (up to 32 bytes), nlow==0 "high" ones (32 bytes with 129 top bits set, or larger than 32 bytes) */
        nlow[n] = der ? 1 : (secp256k1_testrand_bits(3) != 0);
        /* The length of the number in bytes (the first byte of which will always be nonzero) */
        nlen[n] = nlow[n] ? secp256k1_testrand_int(33) : 32 + secp256k1_testrand_int(200) * secp256k1_testrand_bits(3) / 8;
        CHECK(nlen[n] <= 232);
        /* The top bit of the number. */
        nhbit[n] = (nlow[n] == 0 && nlen[n] == 32) ? 1 : (nlen[n] == 0 ? 0 : secp256k1_testrand_bits(1));
        /* The top byte of the number (after the potential hardcoded 16 0xFF characters for "high" 32 bytes numbers) */
        nhbyte[n] = nlen[n] == 0 ? 0 : (nhbit[n] ? 128 + secp256k1_testrand_bits(7) : 1 + secp256k1_testrand_int(127));
        /* The number of zero bytes in front of the number (which is 0 or 1 in case of DER, otherwise we extend up to 300 bytes) */
        nzlen[n] = der ? ((nlen[n] == 0 || nhbit[n]) ? 1 : 0) : (nlow[n] ? secp256k1_testrand_int(3) : secp256k1_testrand_int(300 - nlen[n]) * secp256k1_testrand_bits(3) / 8);
        if (nzlen[n] > ((nlen[n] == 0 || nhbit[n]) ? 1 : 0)) {
            *certainly_not_der = 1;
        }
        CHECK(nlen[n] + nzlen[n] <= 300);
        /* The length of the length descriptor for the number. 0 means short encoding, anything else is long encoding. */
        nlenlen[n] = nlen[n] + nzlen[n] < 128 ? 0 : (nlen[n] + nzlen[n] < 256 ? 1 : 2);
        if (!der) {
            /* nlenlen[n] max 127 bytes */
            int add = secp256k1_testrand_int(127 - nlenlen[n]) * secp256k1_testrand_bits(4) * secp256k1_testrand_bits(4) / 256;
            nlenlen[n] += add;
            if (add != 0) {
                *certainly_not_der = 1;
            }
        }
        CHECK(nlen[n] + nzlen[n] + nlenlen[n] <= 427);
    }

    /* The total length of the data to go, so far */
    tlen = 2 + nlenlen[0] + nlen[0] + nzlen[0] + 2 + nlenlen[1] + nlen[1] + nzlen[1];
    CHECK(tlen <= 856);

    /* The length of the garbage inside the tuple. */
    elen = (der || indet) ? 0 : secp256k1_testrand_int(980 - tlen) * secp256k1_testrand_bits(3) / 8;
    if (elen != 0) {
        *certainly_not_der = 1;
    }
    tlen += elen;
    CHECK(tlen <= 980);

    /* The length of the garbage after the end of the tuple. */
    glen = der ? 0 : secp256k1_testrand_int(990 - tlen) * secp256k1_testrand_bits(3) / 8;
    if (glen != 0) {
        *certainly_not_der = 1;
    }
    CHECK(tlen + glen <= 990);

    /* Write the tuple header. */
    sig[(*len)++] = 0x30;
    if (indet) {
        /* Indeterminate length */
        sig[(*len)++] = 0x80;
        *certainly_not_der = 1;
    } else {
        int tlenlen = tlen < 128 ? 0 : (tlen < 256 ? 1 : 2);
        if (!der) {
            int add = secp256k1_testrand_int(127 - tlenlen) * secp256k1_testrand_bits(4) * secp256k1_testrand_bits(4) / 256;
            tlenlen += add;
            if (add != 0) {
                *certainly_not_der = 1;
            }
        }
        if (tlenlen == 0) {
            /* Short length notation */
            sig[(*len)++] = tlen;
        } else {
            /* Long length notation */
            sig[(*len)++] = 128 + tlenlen;
            assign_big_endian(sig + *len, tlenlen, tlen);
            *len += tlenlen;
        }
        tlen += tlenlen;
    }
    tlen += 2;
    CHECK(tlen + glen <= 1119);

    for (n = 0; n < 2; n++) {
        /* Write the integer header. */
        sig[(*len)++] = 0x02;
        if (nlenlen[n] == 0) {
            /* Short length notation */
            sig[(*len)++] = nlen[n] + nzlen[n];
        } else {
            /* Long length notation. */
            sig[(*len)++] = 128 + nlenlen[n];
            assign_big_endian(sig + *len, nlenlen[n], nlen[n] + nzlen[n]);
            *len += nlenlen[n];
        }
        /* Write zero padding */
        while (nzlen[n] > 0) {
            sig[(*len)++] = 0x00;
            nzlen[n]--;
        }
        if (nlen[n] == 32 && !nlow[n]) {
            /* Special extra 16 0xFF bytes in "high" 32-byte numbers */
            int i;
            for (i = 0; i < 16; i++) {
                sig[(*len)++] = 0xFF;
            }
            nlen[n] -= 16;
        }
        /* Write first byte of number */
        if (nlen[n] > 0) {
            sig[(*len)++] = nhbyte[n];
            nlen[n]--;
        }
        /* Generate remaining random bytes of number */
        secp256k1_testrand_bytes_test(sig + *len, nlen[n]);
        *len += nlen[n];
        nlen[n] = 0;
    }

    /* Generate random garbage inside tuple. */
    secp256k1_testrand_bytes_test(sig + *len, elen);
    *len += elen;

    /* Generate end-of-contents bytes. */
    if (indet) {
        sig[(*len)++] = 0;
        sig[(*len)++] = 0;
        tlen += 2;
    }
    CHECK(tlen + glen <= 1121);

    /* Generate random garbage outside tuple. */
    secp256k1_testrand_bytes_test(sig + *len, glen);
    *len += glen;
    tlen += glen;
    CHECK(tlen <= 1121);
    CHECK(tlen == *len);
}